

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O2

void mat4x4_mul(vec4 *M,vec4 *a,vec4 *b)

{
  int c;
  long lVar1;
  vec4 *pafVar2;
  int i;
  float *pfVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  mat4x4 temp;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    lVar4 = 0;
    pfVar3 = *a;
    for (; lVar4 != 4; lVar4 = lVar4 + 1) {
      fVar6 = 0.0;
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
        fVar6 = fVar6 + pfVar3[lVar5] * *(float *)((long)*b + lVar5);
      }
      temp[lVar1][lVar4] = fVar6;
      pfVar3 = pfVar3 + 1;
    }
    b = b + 1;
  }
  pafVar2 = temp;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      (*M)[lVar4] = (*pafVar2)[lVar4];
    }
    M = M + 1;
    pafVar2 = pafVar2 + 1;
  }
  return;
}

Assistant:

static inline void mat4x4_mul(mat4x4 M, mat4x4 a, mat4x4 b)
{
	mat4x4 temp;
	int k, r, c;
	for(c=0; c<4; ++c) for(r=0; r<4; ++r) {
		temp[c][r] = 0.f;
		for(k=0; k<4; ++k)
			temp[c][r] += a[k][r] * b[c][k];
	}
	mat4x4_dup(M, temp);
}